

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall
irr::video::COpenGL3DriverBase::updateVertexHardwareBuffer
          (COpenGL3DriverBase *this,SHWBufferLink_opengl *HWBuffer)

{
  uint uVar1;
  GLuint GVar2;
  E_HARDWARE_MAPPING EVar3;
  IMeshBuffer *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  GLenum GVar10;
  uint uVar11;
  
  if (HWBuffer == (SHWBufferLink_opengl *)0x0) {
    return false;
  }
  pIVar4 = (HWBuffer->super_SHWBufferLink).MeshBuffer;
  iVar7 = (*pIVar4->_vptr_IMeshBuffer[3])(pIVar4);
  iVar8 = (*pIVar4->_vptr_IMeshBuffer[5])(pIVar4);
  iVar9 = (*pIVar4->_vptr_IMeshBuffer[2])(pIVar4);
  iVar5 = 0x24;
  if (iVar9 == 2) {
    iVar5 = 0x3c;
  }
  iVar6 = 0x2c;
  if (iVar9 != 1) {
    iVar6 = iVar5;
  }
  uVar11 = iVar6 * iVar8;
  if (HWBuffer->vbo_verticesID == 0) {
    (*GL.GenBuffers)(1,&HWBuffer->vbo_verticesID);
    GVar2 = HWBuffer->vbo_verticesID;
    if (GVar2 == 0) {
      return false;
    }
    (*GL.BindBuffer)(0x8892,GVar2);
  }
  else {
    uVar1 = HWBuffer->vbo_verticesSize;
    (*GL.BindBuffer)(0x8892,HWBuffer->vbo_verticesID);
    if (uVar11 <= uVar1) {
      (*GL.BufferSubData)(0x8892,0,(ulong)uVar11,(void *)CONCAT44(extraout_var,iVar7));
      goto LAB_0020c56f;
    }
  }
  HWBuffer->vbo_verticesSize = uVar11;
  EVar3 = (HWBuffer->super_SHWBufferLink).Mapped_Index;
  GVar10 = 0x88e0;
  if (EVar3 != EHM_STREAM) {
    GVar10 = (uint)(EVar3 == EHM_DYNAMIC) * 4 + 0x88e4;
  }
  (*GL.BufferData)(0x8892,(ulong)uVar11,(void *)CONCAT44(extraout_var,iVar7),GVar10);
LAB_0020c56f:
  (*GL.BindBuffer)(0x8892,0);
  return true;
}

Assistant:

bool COpenGL3DriverBase::updateVertexHardwareBuffer(SHWBufferLink_opengl *HWBuffer)
{
	if (!HWBuffer)
		return false;

	const scene::IMeshBuffer *mb = HWBuffer->MeshBuffer;
	const void *vertices = mb->getVertices();
	const u32 vertexCount = mb->getVertexCount();
	const E_VERTEX_TYPE vType = mb->getVertexType();
	const u32 vertexSize = getVertexPitchFromType(vType);

	const void *buffer = vertices;
	size_t bufferSize = vertexSize * vertexCount;

	// get or create buffer
	bool newBuffer = false;
	if (!HWBuffer->vbo_verticesID) {
		GL.GenBuffers(1, &HWBuffer->vbo_verticesID);
		if (!HWBuffer->vbo_verticesID)
			return false;
		newBuffer = true;
	} else if (HWBuffer->vbo_verticesSize < bufferSize) {
		newBuffer = true;
	}

	GL.BindBuffer(GL_ARRAY_BUFFER, HWBuffer->vbo_verticesID);

	// copy data to graphics card
	if (!newBuffer)
		GL.BufferSubData(GL_ARRAY_BUFFER, 0, bufferSize, buffer);
	else {
		HWBuffer->vbo_verticesSize = bufferSize;

		GLenum usage = GL_STATIC_DRAW;
		if (HWBuffer->Mapped_Index == scene::EHM_STREAM)
			usage = GL_STREAM_DRAW;
		else if (HWBuffer->Mapped_Index == scene::EHM_DYNAMIC)
			usage = GL_DYNAMIC_DRAW;
		GL.BufferData(GL_ARRAY_BUFFER, bufferSize, buffer, usage);
	}

	GL.BindBuffer(GL_ARRAY_BUFFER, 0);

	return (!testGLError(__LINE__));
}